

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbclipboard.cpp
# Opt level: O2

QVariant * __thiscall
QXcbClipboardMime::retrieveData_sys
          (QVariant *__return_storage_ptr__,QXcbClipboardMime *this,QString *fmt,QMetaType type)

{
  QXcbConnection *connection;
  bool bVar1;
  int iVar2;
  xcb_atom_t fmtAtom;
  QByteArray *d;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  bool hasUtf8;
  bool local_89;
  QArrayDataPointer<unsigned_int> local_88;
  QArrayDataPointer<QString> local_70;
  _Storage<QByteArray,_false> local_58;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fmt->d).size != 0) {
    bVar1 = isEmpty(this);
    if (!bVar1) {
      (**(code **)(*(long *)this + 0x68))(&local_70,this);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      local_88.size = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = (uint *)0x0;
      puVar4 = *(undefined8 **)(this + 0x40);
      uVar3 = *(ulong *)(this + 0x48);
      if (puVar4 == (undefined8 *)0x0) {
        puVar4 = &QByteArray::_empty;
      }
      iVar2 = (int)(uVar3 >> 2);
      QList<unsigned_int>::reserve((QList<unsigned_int> *)&local_88,(long)iVar2);
      uVar5 = 0;
      uVar3 = uVar3 >> 2 & 0xffffffff;
      if (iVar2 < 1) {
        uVar3 = uVar5;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        QList<unsigned_int>::append
                  ((QList<unsigned_int> *)&local_88,*(parameter_type *)((long)puVar4 + uVar5 * 4));
      }
      local_89 = false;
      fmtAtom = QXcbMime::mimeAtomForFormat
                          (*(QXcbConnection **)(*(long *)(this + 0x18) + 8),fmt,type,
                           (QList<unsigned_int> *)&local_88,&local_89);
      if (fmtAtom == 0) {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      }
      else {
        local_58._M_value.d.size = -0x5555555555555556;
        uStack_40 = 0xaaaaaaaaaaaaaaaa;
        local_58._M_value.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58._M_value.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QXcbClipboard::getDataInFormat
                  ((optional<QByteArray> *)&local_58._M_value,*(QXcbClipboard **)(this + 0x18),
                   *(xcb_atom_t *)(this + 0x10),fmtAtom);
        if ((char)uStack_40 == '\0') {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        }
        else {
          connection = *(QXcbConnection **)(*(long *)(this + 0x18) + 8);
          d = std::optional<QByteArray>::value((optional<QByteArray> *)&local_58._M_value);
          QXcbMime::mimeConvertToFormat
                    (__return_storage_ptr__,connection,fmtAtom,d,fmt,type,local_89);
        }
        std::_Optional_payload_base<QByteArray>::_M_reset
                  ((_Optional_payload_base<QByteArray> *)&local_58._M_value);
      }
      QArrayDataPointer<unsigned_int>::~QArrayDataPointer(&local_88);
      goto LAB_00139c66;
    }
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00139c66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant retrieveData_sys(const QString &fmt, QMetaType type) const override
    {
        auto requestedType = type;
        if (fmt.isEmpty() || isEmpty())
            return QVariant();

        (void)formats(); // trigger update of format list

        QList<xcb_atom_t> atoms;
        const xcb_atom_t *targets = (const xcb_atom_t *) format_atoms.data();
        int size = format_atoms.size() / sizeof(xcb_atom_t);
        atoms.reserve(size);
        for (int i = 0; i < size; ++i)
            atoms.append(targets[i]);

        bool hasUtf8 = false;
        xcb_atom_t fmtatom = mimeAtomForFormat(m_clipboard->connection(), fmt, requestedType, atoms, &hasUtf8);

        if (fmtatom == 0)
            return QVariant();

        const std::optional<QByteArray> result = m_clipboard->getDataInFormat(modeAtom, fmtatom);
        if (!result.has_value())
            return QVariant();

        return mimeConvertToFormat(m_clipboard->connection(), fmtatom, result.value(), fmt, requestedType, hasUtf8);
    }